

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall
helics::Interface::Interface
          (Interface *this,Federate *federate,InterfaceHandle hid,string_view actName)

{
  element_type *peVar1;
  allocator<char> local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = actName._M_str;
  local_20._M_len = actName._M_len;
  this->_vptr_Interface = (_func_int **)&PTR__Interface_004d3200;
  this->mCore = (Core *)0x0;
  (this->handle).hid = hid.hid;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->mName,&local_20,&local_21);
  if ((federate != (Federate *)0x0) &&
     (peVar1 = (federate->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    this->mCore = peVar1;
  }
  return;
}

Assistant:

Interface::Interface(Federate* federate, InterfaceHandle hid, std::string_view actName):
    handle(hid), mName(actName)
{
    if (federate != nullptr) {
        const auto& crp = federate->getCorePointer();
        if (crp) {
            mCore = crp.get();
        }
    }
}